

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O3

bool Diligent::VerifyTraceRaysAttribs(TraceRaysAttribs *Attribs)

{
  int iVar1;
  char (*in_RCX) [77];
  IShaderBindingTable *pIVar2;
  string msg;
  string local_30;
  
  pIVar2 = Attribs->pSBT;
  if (pIVar2 == (IShaderBindingTable *)0x0) {
    FormatString<char[33],char[23]>
              (&local_30,(Diligent *)"Trace rays attribs are invalid: ",
               (char (*) [33])"pSBT must not be null.",(char (*) [23])in_RCX);
    in_RCX = (char (*) [77])0x43e;
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"VerifyTraceRaysAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x43e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    pIVar2 = Attribs->pSBT;
  }
  iVar1 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[8])(pIVar2,5);
  if ((char)iVar1 == '\0') {
    FormatString<char[33],char[77]>
              (&local_30,(Diligent *)"Trace rays attribs are invalid: ",
               (char (*) [33])
               "not all shaders in SBT are bound or instance to shader mapping is incorrect.",in_RCX
              );
    in_RCX = (char (*) [77])0x442;
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"VerifyTraceRaysAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x442);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  if (Attribs->DimensionX == 0) {
    FormatString<char[33],char[29]>
              (&local_30,(Diligent *)"Trace rays attribs are invalid: ",
               (char (*) [33])"DimensionX must not be zero.",(char (*) [29])in_RCX);
    in_RCX = (char (*) [77])0x445;
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"VerifyTraceRaysAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x445);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  if (Attribs->DimensionY == 0) {
    FormatString<char[33],char[29]>
              (&local_30,(Diligent *)"Trace rays attribs are invalid: ",
               (char (*) [33])"DimensionY must not be zero.",(char (*) [29])in_RCX);
    in_RCX = (char (*) [77])0x446;
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"VerifyTraceRaysAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x446);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  if (Attribs->DimensionZ == 0) {
    FormatString<char[33],char[29]>
              (&local_30,(Diligent *)"Trace rays attribs are invalid: ",
               (char (*) [33])"DimensionZ must not be zero.",(char (*) [29])in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"VerifyTraceRaysAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x447);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return true;
}

Assistant:

bool VerifyTraceRaysAttribs(const TraceRaysAttribs& Attribs)
{
#define CHECK_TRACE_RAYS_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Trace rays attribs are invalid: ", __VA_ARGS__)
    CHECK_TRACE_RAYS_ATTRIBS(Attribs.pSBT != nullptr, "pSBT must not be null.");

#ifdef DILIGENT_DEVELOPMENT
    CHECK_TRACE_RAYS_ATTRIBS(Attribs.pSBT->Verify(VERIFY_SBT_FLAG_SHADER_ONLY | VERIFY_SBT_FLAG_TLAS),
                             "not all shaders in SBT are bound or instance to shader mapping is incorrect.");
#endif // DILIGENT_DEVELOPMENT

    CHECK_TRACE_RAYS_ATTRIBS(Attribs.DimensionX != 0, "DimensionX must not be zero.");
    CHECK_TRACE_RAYS_ATTRIBS(Attribs.DimensionY != 0, "DimensionY must not be zero.");
    CHECK_TRACE_RAYS_ATTRIBS(Attribs.DimensionZ != 0, "DimensionZ must not be zero.");

#undef CHECK_TRACE_RAYS_ATTRIBS

    return true;
}